

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexArray.cpp
# Opt level: O0

void __thiscall
btTriangleIndexVertexArray::getLockedVertexIndexBase
          (btTriangleIndexVertexArray *this,uchar **vertexbase,int *numverts,PHY_ScalarType *type,
          int *vertexStride,uchar **indexbase,int *indexstride,int *numfaces,
          PHY_ScalarType *indicestype,int subpart)

{
  btIndexedMesh *pbVar1;
  PHY_ScalarType *in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int *in_R8;
  undefined8 *in_R9;
  btIndexedMesh *mesh;
  
  pbVar1 = btAlignedObjectArray<btIndexedMesh>::operator[]
                     ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 0x18),(int)numverts);
  *in_RDX = pbVar1->m_numVertices;
  *in_RSI = pbVar1->m_vertexBase;
  *in_RCX = pbVar1->m_vertexType;
  *in_R8 = pbVar1->m_vertexStride;
  *vertexStride = pbVar1->m_numTriangles;
  *in_R9 = pbVar1->m_triangleIndexBase;
  *(int *)indexbase = pbVar1->m_triangleIndexStride;
  *type = pbVar1->m_indexType;
  return;
}

Assistant:

void	btTriangleIndexVertexArray::getLockedVertexIndexBase(unsigned char **vertexbase, int& numverts,PHY_ScalarType& type, int& vertexStride,unsigned char **indexbase,int & indexstride,int& numfaces,PHY_ScalarType& indicestype,int subpart)
{
	btAssert(subpart< getNumSubParts() );

	btIndexedMesh& mesh = m_indexedMeshes[subpart];

	numverts = mesh.m_numVertices;
	(*vertexbase) = (unsigned char *) mesh.m_vertexBase;

   type = mesh.m_vertexType;

	vertexStride = mesh.m_vertexStride;

	numfaces = mesh.m_numTriangles;

	(*indexbase) = (unsigned char *)mesh.m_triangleIndexBase;
	indexstride = mesh.m_triangleIndexStride;
	indicestype = mesh.m_indexType;
}